

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O0

void __thiscall
cppcms::impl::tcp_cache_service::server::on_accept
          (server *this,error_code *e,shared_ptr<cppcms::impl::tcp_cache_service::session> *s)

{
  bool bVar1;
  level_type lVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  long *plVar6;
  element_type *peVar7;
  long lVar8;
  long lVar9;
  callback *obj;
  error_code *in_RSI;
  shared_ptr<cppcms::impl::tcp_cache_service::session> *in_stack_fffffffffffffe88;
  shared_ptr<cppcms::impl::tcp_cache_service::session> *in_stack_fffffffffffffe90;
  error_code *in_stack_fffffffffffffea8;
  undefined1 *mem;
  binderX<cppcms::impl::tcp_cache_service::session,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
  *in_stack_fffffffffffffed8;
  ostream *in_stack_fffffffffffffee0;
  session *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  byte bVar10;
  message local_d8 [48];
  code *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [79];
  byte local_49;
  binderX<cppcms::impl::tcp_cache_service::session,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
  local_48 [2];
  
  bVar1 = std::error_code::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    lVar2 = booster::log::logger::instance();
    uVar4 = booster::log::logger::should_be_logged(lVar2,(char *)0x1e);
    bVar10 = 0;
    if ((uVar4 & 1) != 0) {
      booster::log::message::message
                (local_d8,error,"cppcms_scale",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/tcp_cache_server.cpp"
                 ,0x140);
      bVar10 = 1;
      poVar5 = (ostream *)booster::log::message::out();
      poVar5 = std::operator<<(poVar5,"Failed to accept connection:");
      std::error_code::message_abi_cxx11_(in_stack_fffffffffffffea8);
      poVar5 = std::operator<<(poVar5,(string *)&stack0xffffffffffffff00);
      std::ios::operator_cast_to_bool(poVar5 + *(long *)(*(long *)poVar5 + -0x18));
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
    }
    if ((bVar10 & 1) != 0) {
      booster::log::message::~message(local_d8);
    }
  }
  else {
    lVar2 = booster::log::logger::instance();
    uVar4 = booster::log::logger::should_be_logged(lVar2,(char *)0x46);
    local_49 = 0;
    if ((uVar4 & 1) != 0) {
      in_stack_fffffffffffffed8 = local_48;
      booster::log::message::message
                ((message *)in_stack_fffffffffffffed8,debug,"cppcms_scale",
                 "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/tcp_cache_server.cpp"
                 ,0x135);
      local_49 = 1;
      in_stack_fffffffffffffee0 = (ostream *)booster::log::message::out();
      poVar5 = std::operator<<(in_stack_fffffffffffffee0,"Accepted connection, fd=");
      std::
      __shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x483df6);
      iVar3 = booster::aio::basic_io_device::native();
      plVar6 = (long *)std::ostream::operator<<(poVar5,iVar3);
      std::ios::operator_cast_to_bool((void *)((long)plVar6 + *(long *)(*plVar6 + -0x18)));
    }
    if ((local_49 & 1) != 0) {
      booster::log::message::~message((message *)local_48);
    }
    peVar7 = std::
             __shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x483e5b);
    booster::aio::basic_socket::set_option(&peVar7->socket_,0,1);
    lVar8 = booster::aio::basic_io_device::get_io_service();
    std::
    __shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x483e8a);
    lVar9 = booster::aio::basic_io_device::get_io_service();
    if (lVar8 == lVar9) {
      std::
      __shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x483eb0);
      tcp_cache_service::session::run(in_stack_ffffffffffffff00);
    }
    else {
      std::
      __shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<cppcms::impl::tcp_cache_service::session,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x483ef9);
      obj = (callback *)booster::aio::basic_io_device::get_io_service();
      mem = local_98;
      std::shared_ptr<cppcms::impl::tcp_cache_service::session>::shared_ptr
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      local_a8 = tcp_cache_service::session::run;
      local_a0 = 0;
      util::
      mem_bind<cppcms::impl::tcp_cache_service::session,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
                ((offset_in_session_to_subr)mem,
                 (shared_ptr<cppcms::impl::tcp_cache_service::session> *)obj);
      booster::callback<void()>::
      callback<cppcms::util::details::binderX<cppcms::impl::tcp_cache_service::session,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>>
                ((callback<void_()> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      booster::aio::io_service::post(obj);
      booster::callback<void_()>::~callback((callback<void_()> *)0x483f9b);
      util::details::
      binderX<cppcms::impl::tcp_cache_service::session,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
      ::~binderX((binderX<cppcms::impl::tcp_cache_service::session,_std::shared_ptr<cppcms::impl::tcp_cache_service::session>_>
                  *)0x483fa8);
      std::shared_ptr<cppcms::impl::tcp_cache_service::session>::~shared_ptr
                ((shared_ptr<cppcms::impl::tcp_cache_service::session> *)0x483fb5);
    }
    start_accept((server *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  }
  return;
}

Assistant:

void on_accept(booster::system::error_code const &e,booster::shared_ptr<tcp_cache_service::session> s)
	{
		if(!e) {
			BOOSTER_DEBUG("cppcms_scale") << "Accepted connection, fd=" << s->socket_.native();
			s->socket_.set_option(io::stream_socket::tcp_no_delay,true);
			if(&acceptor_.get_io_service()  == &s->socket_.get_io_service()) {
				s->run();
			}
			else {
				s->socket_.get_io_service().post(mem_bind(&session::run,s));
			}
			start_accept();
		}
		else {
			BOOSTER_ERROR("cppcms_scale") << "Failed to accept connection:" << e.message();
		}
	}